

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avCodecs.h
# Opt level: O3

void __thiscall
CodecInfo::CodecInfo(CodecInfo *this,int codecID,string *displayName,string *programName)

{
  (this->displayName)._M_dataplus._M_p = (pointer)&(this->displayName).field_2;
  (this->displayName)._M_string_length = 0;
  (this->displayName).field_2._M_local_buf[0] = '\0';
  (this->programName)._M_dataplus._M_p = (pointer)&(this->programName).field_2;
  (this->programName)._M_string_length = 0;
  (this->programName).field_2._M_local_buf[0] = '\0';
  this->codecID = codecID;
  std::__cxx11::string::_M_assign((string *)&this->displayName);
  std::__cxx11::string::_M_assign((string *)&this->programName);
  return;
}

Assistant:

CodecInfo(const int codecID, const std::string& displayName, const std::string& programName)
    {
        this->codecID = codecID;
        this->displayName = displayName;
        this->programName = programName;
    }